

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O1

void __thiscall
helics::ValueFederate::ValueFederate(ValueFederate *this,string_view fedName,string *configString)

{
  FederateInfo local_1d0;
  
  loadFederateInfo(&local_1d0,(string *)configString);
  Federate::Federate((Federate *)&this->field_0x10,(string_view)fedName,&local_1d0);
  FederateInfo::~FederateInfo(&local_1d0);
  this->_vptr_ValueFederate = (_func_int **)0x4cac68;
  *(undefined8 *)&this->field_0x10 = 0x4cad38;
  (this->vfManager)._M_t.
  super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
  .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl =
       (ValueFederateManager *)0x0;
  loadFederateData(this);
  return;
}

Assistant:

ValueFederate::ValueFederate(std::string_view fedName, const std::string& configString):
    Federate(fedName, loadFederateInfo(configString))
{
    loadFederateData();
}